

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::handleElementPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIElement *elementInfo)

{
  short *psVar1;
  short *psVar2;
  DOMDocumentImpl *pDVar3;
  PSVIHandler *pPVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  XMLCh *pXVar8;
  ulong uVar9;
  DOMStringPoolEntry *pDVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar11;
  undefined4 extraout_var_14;
  DOMStringPoolEntry *pDVar12;
  XMLCh *pXVar13;
  XMLCh XVar14;
  DOMDocument *pDVar15;
  XMLSize_t XVar16;
  undefined4 extraout_var_04;
  
  if (this->fCreateSchemaInfo == true) {
    pDVar15 = &this->fDocument->super_DOMDocument;
    if (this->fDocument == (DOMDocumentImpl *)0x0) {
      pDVar15 = (DOMDocument *)0x0;
    }
    iVar7 = (*(pDVar15->super_DOMNode)._vptr_DOMNode[0x26])
                      (&pDVar15->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
    this_00 = (DOMTypeInfoImpl *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x20))
                        ((long *)CONCAT44(extraout_var,iVar7));
    DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
              (this_00,0,(ulong)(elementInfo->super_PSVIItem).fValidityState);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
              (this_00,1,(ulong)(elementInfo->super_PSVIItem).fAssessmentType);
    iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
    if (CONCAT44(extraout_var_00,iVar7) == 0) {
      if ((elementInfo->super_PSVIItem).fValidityState == VALIDITY_VALID) {
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0xf);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,4,&SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                  (this_00,3,&SchemaSymbols::fgATTVAL_ANYTYPE);
      }
    }
    else {
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                (this_00,2,(ulong)*(uint *)(CONCAT44(extraout_var_01,iVar7) + 0x28));
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      bVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x38))
                        ((long *)CONCAT44(extraout_var_02,iVar7));
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)bVar5);
      pDVar3 = this->fDocument;
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x18))
                                  ((long *)CONCAT44(extraout_var_03,iVar7));
      if (pXVar8 == (XMLCh *)0x0) {
        pXVar13 = (XMLCh *)0x0;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 != 0);
        uVar9 = (ulong)(ushort)*pXVar8;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar14 = pXVar8[1];
          if (XVar14 != L'\0') {
            pXVar13 = pXVar8 + 2;
            do {
              uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar14 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar14 != L'\0');
          }
          uVar9 = uVar9 % pDVar3->fNameTableSize;
        }
        XVar16 = (lVar11 >> 1) - 1;
        pDVar10 = pDVar3->fNameTable[uVar9];
        if (pDVar10 == (DOMStringPoolEntry *)0x0) {
          pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
        }
        else {
          do {
            pDVar12 = pDVar10;
            if (pDVar12->fLength == XVar16) {
              pXVar13 = pDVar12->fString;
              if (pXVar13 == pXVar8) goto LAB_002de510;
              lVar11 = 0;
              do {
                psVar1 = (short *)((long)pXVar13 + lVar11);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002de510;
                  break;
                }
                psVar2 = (short *)((long)pXVar8 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar10 = pDVar12->fNext;
          } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (pDVar3,XVar16 * 2 + 0x18);
        pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_04,iVar7);
        pDVar12->fNext = pDVar10;
        pDVar10->fLength = XVar16;
        pDVar10->fNext = (DOMStringPoolEntry *)0x0;
        pXVar13 = pDVar10->fString;
        XMLString::copyString(pXVar13,pXVar8);
      }
LAB_002de510:
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar13);
      pDVar3 = this->fDocument;
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[2])(elementInfo);
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x10))
                                  ((long *)CONCAT44(extraout_var_05,iVar7));
      if (pXVar8 == (XMLCh *)0x0) {
        pXVar13 = (XMLCh *)0x0;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 != 0);
        uVar9 = (ulong)(ushort)*pXVar8;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar14 = pXVar8[1];
          if (XVar14 != L'\0') {
            pXVar13 = pXVar8 + 2;
            do {
              uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar14 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar14 != L'\0');
          }
          uVar9 = uVar9 % pDVar3->fNameTableSize;
        }
        XVar16 = (lVar11 >> 1) - 1;
        pDVar10 = pDVar3->fNameTable[uVar9];
        if (pDVar10 == (DOMStringPoolEntry *)0x0) {
          pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
        }
        else {
          do {
            pDVar12 = pDVar10;
            if (pDVar12->fLength == XVar16) {
              pXVar13 = pDVar12->fString;
              if (pXVar13 == pXVar8) goto LAB_002de635;
              lVar11 = 0;
              do {
                psVar1 = (short *)((long)pXVar13 + lVar11);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002de635;
                  break;
                }
                psVar2 = (short *)((long)pXVar8 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar10 = pDVar12->fNext;
          } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (pDVar3,XVar16 * 2 + 0x18);
        pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_06,iVar7);
        pDVar12->fNext = pDVar10;
        pDVar10->fLength = XVar16;
        pDVar10->fNext = (DOMStringPoolEntry *)0x0;
        pXVar13 = pDVar10->fString;
        XMLString::copyString(pXVar13,pXVar8);
      }
LAB_002de635:
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar13);
    }
    iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
    if (CONCAT44(extraout_var_07,iVar7) != 0) {
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      bVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x38))
                        ((long *)CONCAT44(extraout_var_08,iVar7));
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)bVar5);
      pDVar3 = this->fDocument;
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar7) + 0x18))
                                  ((long *)CONCAT44(extraout_var_09,iVar7));
      if (pXVar8 == (XMLCh *)0x0) {
        pXVar13 = (XMLCh *)0x0;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 != 0);
        uVar9 = (ulong)(ushort)*pXVar8;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar14 = pXVar8[1];
          if (XVar14 != L'\0') {
            pXVar13 = pXVar8 + 2;
            do {
              uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar14 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar14 != L'\0');
          }
          uVar9 = uVar9 % pDVar3->fNameTableSize;
        }
        XVar16 = (lVar11 >> 1) - 1;
        pDVar10 = pDVar3->fNameTable[uVar9];
        if (pDVar10 == (DOMStringPoolEntry *)0x0) {
          pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
        }
        else {
          do {
            pDVar12 = pDVar10;
            if (pDVar12->fLength == XVar16) {
              pXVar13 = pDVar12->fString;
              if (pXVar13 == pXVar8) goto LAB_002de790;
              lVar11 = 0;
              do {
                psVar1 = (short *)((long)pXVar13 + lVar11);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002de790;
                  break;
                }
                psVar2 = (short *)((long)pXVar8 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar10 = pDVar12->fNext;
          } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (pDVar3,XVar16 * 2 + 0x18);
        pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_10,iVar7);
        pDVar12->fNext = pDVar10;
        pDVar10->fLength = XVar16;
        pDVar10->fNext = (DOMStringPoolEntry *)0x0;
        pXVar13 = pDVar10->fString;
        XMLString::copyString(pXVar13,pXVar8);
      }
LAB_002de790:
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar13);
      pDVar3 = this->fDocument;
      iVar7 = (*(elementInfo->super_PSVIItem)._vptr_PSVIItem[3])(elementInfo);
      pXVar8 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar7) + 0x10))
                                  ((long *)CONCAT44(extraout_var_11,iVar7));
      if (pXVar8 == (XMLCh *)0x0) {
        pXVar13 = (XMLCh *)0x0;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 != 0);
        uVar9 = (ulong)(ushort)*pXVar8;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          XVar14 = pXVar8[1];
          if (XVar14 != L'\0') {
            pXVar13 = pXVar8 + 2;
            do {
              uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
              XVar14 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar14 != L'\0');
          }
          uVar9 = uVar9 % pDVar3->fNameTableSize;
        }
        XVar16 = (lVar11 >> 1) - 1;
        pDVar10 = pDVar3->fNameTable[uVar9];
        if (pDVar10 == (DOMStringPoolEntry *)0x0) {
          pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
        }
        else {
          do {
            pDVar12 = pDVar10;
            if (pDVar12->fLength == XVar16) {
              pXVar13 = pDVar12->fString;
              if (pXVar13 == pXVar8) goto LAB_002de8b5;
              lVar11 = 0;
              do {
                psVar1 = (short *)((long)pXVar13 + lVar11);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002de8b5;
                  break;
                }
                psVar2 = (short *)((long)pXVar8 + lVar11);
                lVar11 = lVar11 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar10 = pDVar12->fNext;
          } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (pDVar3,XVar16 * 2 + 0x18);
        pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_12,iVar7);
        pDVar12->fNext = pDVar10;
        pDVar10->fLength = XVar16;
        pDVar10->fNext = (DOMStringPoolEntry *)0x0;
        pXVar13 = pDVar10->fString;
        XMLString::copyString(pXVar13,pXVar8);
      }
LAB_002de8b5:
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar13);
    }
    if (elementInfo->fElementDecl != (XSElementDeclaration *)0x0) {
      bVar6 = XSElementDeclaration::getNillable(elementInfo->fElementDecl);
      (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,6,(ulong)bVar6);
    }
    pXVar8 = (elementInfo->super_PSVIItem).fDefaultValue;
    if (pXVar8 == (XMLCh *)0x0) {
      pXVar13 = (XMLCh *)0x0;
    }
    else {
      pDVar3 = this->fDocument;
      lVar11 = 0;
      do {
        psVar1 = (short *)((long)pXVar8 + lVar11);
        lVar11 = lVar11 + 2;
      } while (*psVar1 != 0);
      uVar9 = (ulong)(ushort)*pXVar8;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        XVar14 = pXVar8[1];
        if (XVar14 != L'\0') {
          pXVar13 = pXVar8 + 2;
          do {
            uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
            XVar14 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar14 != L'\0');
        }
        uVar9 = uVar9 % pDVar3->fNameTableSize;
      }
      XVar16 = (lVar11 >> 1) - 1;
      pDVar10 = pDVar3->fNameTable[uVar9];
      if (pDVar10 == (DOMStringPoolEntry *)0x0) {
        pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
      }
      else {
        do {
          pDVar12 = pDVar10;
          if (pDVar12->fLength == XVar16) {
            pXVar13 = pDVar12->fString;
            if (pXVar13 == pXVar8) goto LAB_002de9eb;
            lVar11 = 0;
            do {
              psVar1 = (short *)((long)pXVar13 + lVar11);
              if (*psVar1 == 0) {
                if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002de9eb;
                break;
              }
              psVar2 = (short *)((long)pXVar8 + lVar11);
              lVar11 = lVar11 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar10 = pDVar12->fNext;
        } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (pDVar3,XVar16 * 2 + 0x18);
      pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_13,iVar7);
      pDVar12->fNext = pDVar10;
      pDVar10->fLength = XVar16;
      pDVar10->fNext = (DOMStringPoolEntry *)0x0;
      pXVar13 = pDVar10->fString;
      XMLString::copyString(pXVar13,pXVar8);
    }
LAB_002de9eb:
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar13);
    pXVar8 = (elementInfo->super_PSVIItem).fNormalizedValue;
    if (pXVar8 == (XMLCh *)0x0) {
      pXVar13 = (XMLCh *)0x0;
    }
    else {
      pDVar3 = this->fDocument;
      lVar11 = 0;
      do {
        psVar1 = (short *)((long)pXVar8 + lVar11);
        lVar11 = lVar11 + 2;
      } while (*psVar1 != 0);
      uVar9 = (ulong)(ushort)*pXVar8;
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        XVar14 = pXVar8[1];
        if (XVar14 != L'\0') {
          pXVar13 = pXVar8 + 2;
          do {
            uVar9 = (ulong)(ushort)XVar14 + (uVar9 >> 0x18) + uVar9 * 0x26;
            XVar14 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar14 != L'\0');
        }
        uVar9 = uVar9 % pDVar3->fNameTableSize;
      }
      XVar16 = (lVar11 >> 1) - 1;
      pDVar10 = pDVar3->fNameTable[uVar9];
      if (pDVar10 == (DOMStringPoolEntry *)0x0) {
        pDVar12 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
      }
      else {
        do {
          pDVar12 = pDVar10;
          if (pDVar12->fLength == XVar16) {
            pXVar13 = pDVar12->fString;
            if (pXVar13 == pXVar8) goto LAB_002deb01;
            lVar11 = 0;
            do {
              psVar1 = (short *)((long)pXVar13 + lVar11);
              if (*psVar1 == 0) {
                if (*(short *)((long)pXVar8 + lVar11) == 0) goto LAB_002deb01;
                break;
              }
              psVar2 = (short *)((long)pXVar8 + lVar11);
              lVar11 = lVar11 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar10 = pDVar12->fNext;
        } while (pDVar12->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (pDVar3,XVar16 * 2 + 0x18);
      pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_14,iVar7);
      pDVar12->fNext = pDVar10;
      pDVar10->fLength = XVar16;
      pDVar10->fNext = (DOMStringPoolEntry *)0x0;
      pXVar13 = pDVar10->fString;
      XMLString::copyString(pXVar13,pXVar8);
    }
LAB_002deb01:
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar13);
    (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
    (*this->fCurrentParent->_vptr_DOMNode[0x4d])(this->fCurrentParent,this_00);
  }
  pPVar4 = this->fPSVIHandler;
  if (pPVar4 == (PSVIHandler *)0x0) {
    return;
  }
  (*pPVar4->_vptr_PSVIHandler[2])(pPVar4,localName,uri,elementInfo);
  return;
}

Assistant:

void AbstractDOMParser::handleElementPSVI(const XMLCh* const            localName
                                        , const XMLCh* const            uri
                                        ,       PSVIElement *           elementInfo)
{
    // associate the info now; if the user wants, she can override what we did
    if(fCreateSchemaInfo)
    {
        DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, elementInfo->getValidity());
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, elementInfo->getValidationAttempted());
        if(elementInfo->getTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, elementInfo->getTypeDefinition()->getTypeCategory());
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, elementInfo->getTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getTypeDefinition()->getName()));
        }
        else if(elementInfo->getValidity()==PSVIItem::VALIDITY_VALID)
        {
            // if we are valid but we don't have a type validator, we are xs:anyType
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::COMPLEX_TYPE);
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgATTVAL_ANYTYPE);
        }
        if(elementInfo->getMemberTypeDefinition())
        {
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, elementInfo->getMemberTypeDefinition()->getAnonymous());
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getNamespace()));
            typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                fDocument->getPooledString(elementInfo->getMemberTypeDefinition()->getName()));
        }
        if(elementInfo->getElementDeclaration())
            typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Nil, elementInfo->getElementDeclaration()->getNillable());
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(elementInfo->getSchemaDefault()));
        typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(elementInfo->getSchemaNormalizedValue()));
        typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
        ((DOMElementNSImpl*)fCurrentParent)->setSchemaTypeInfo(typeInfo);
    }
    if(fPSVIHandler)
        fPSVIHandler->handleElementPSVI(localName, uri, elementInfo);
}